

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void libdef_name(char *p,int kind)

{
  uint8_t *__dest;
  char cVar1;
  size_t sVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  size_t __n;
  FILE *__stream;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  dasm_State *pdVar13;
  int extraout_EDX;
  dasm_State *__s;
  uint uVar14;
  int *__s_00;
  uint uVar15;
  BuildCtx *ctx;
  uint *puVar16;
  BuildCtx *pBVar17;
  uint uVar18;
  uint uVar19;
  uint32_t uVar20;
  uint8_t *puVar21;
  ulong uVar22;
  bool bVar23;
  char *pcStack_81c0;
  int iStack_8160;
  short sStack_815c;
  char cStack_815a;
  char cStack_8159;
  undefined1 auStack_8158 [248];
  char *apcStack_8060 [4097];
  BuildCtx *pBStack_58;
  
  __s_00 = (int *)(ulong)(uint)kind;
  ctx = (BuildCtx *)p;
  iVar8 = kind;
  __n = strlen(p);
  sVar2 = modnamelen;
  if (((kind != 0xc0) && (modnamelen < __n)) && (p[modnamelen] == '_')) {
    iVar8 = 0x11b260;
    ctx = (BuildCtx *)p;
    iVar4 = strncmp(p,modname,modnamelen);
    if (iVar4 == 0) {
      p = p + sVar2 + 1;
      __n = __n - (sVar2 + 1);
    }
  }
  if (__n < 0x39) {
    if (optr + __n + 3 < (uint8_t *)((long)&optr + 1U)) {
      __dest = optr + 1;
      puVar21 = optr + __n + 1;
      *optr = (byte)kind | (byte)__n;
      memcpy(__dest,p,__n);
      optr = puVar21;
      return;
    }
  }
  else {
    ctx = (BuildCtx *)p;
    libdef_name_cold_2();
  }
  libdef_name_cold_1();
  pBVar17 = (BuildCtx *)*ctx->args;
  pBStack_58 = (BuildCtx *)p;
  if (pBVar17 == (BuildCtx *)0x0) {
LAB_0010c5f2:
    emit_fold_cold_6();
  }
  else {
    if ((*(char *)&pBVar17->D == '-') &&
       (__stream = _stdin, *(char *)((long)&pBVar17->D + 1) == '\0')) {
LAB_0010c290:
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx->fp);
      fwrite("static const FoldFunc fold_func[] = {\n",0x26,1,(FILE *)ctx->fp);
      lineno = 0;
      funcidx = 0;
      nkeys = 0;
      pcVar9 = fgets((char *)&iStack_8160,0x100,__stream);
      pcVar10 = (char *)ctx;
      if (pcVar9 != (char *)0x0) {
        __s_00 = &iStack_8160;
        do {
          lineno = lineno + 1;
          if (sStack_815c == 0x444c && iStack_8160 == 0x4f464a4c) {
            pcVar10 = strchr(&cStack_815a,0x29);
            if (pcVar10 == (char *)0x0 || cStack_815a != '(') {
              if (((cStack_815a != 'X') && (cStack_815a != 'F')) ||
                 ((cStack_8159 != '(' || (pcVar10 == (char *)0x0)))) {
LAB_0010c5db:
                iVar8 = (int)&cStack_815a;
                emit_fold_cold_2();
                goto LAB_0010c5ed;
              }
              *pcVar10 = '\0';
              if (funcidx != 0) {
                fwrite(",\n",2,1,(FILE *)ctx->fp);
              }
              pcVar10 = "  fold_%s";
              if (cStack_815a == 'X') {
                pcVar10 = "  %s";
              }
              fprintf((FILE *)ctx->fp,pcVar10,auStack_8158);
              funcidx = funcidx + 1;
              pBVar17 = ctx;
            }
            else {
              *pcVar10 = '\0';
              apcStack_8060[0] = &cStack_8159;
              uVar5 = nexttoken(apcStack_8060,0,0);
              pBVar17 = (BuildCtx *)(ulong)uVar5;
              uVar6 = nexttoken(apcStack_8060,0,0x7f);
              iVar8 = 1;
              uVar7 = nexttoken(apcStack_8060,1,0x3ff);
              uVar3 = nkeys;
              uVar20 = funcidx;
              uVar11 = (ulong)nkeys;
              if (0xfff < uVar11) {
LAB_0010c5ed:
                emit_fold_cold_4();
                goto LAB_0010c5f2;
              }
              pBVar17 = (BuildCtx *)(ulong)(uVar5 << 0x11);
              uVar19 = uVar6 << 10 | uVar5 << 0x11 | uVar7;
              if (uVar11 == 0) {
                uVar14 = 0;
              }
              else {
                uVar15 = uVar19 & 0xffffff;
                puVar16 = foldkeys + uVar11;
                do {
                  uVar14 = (uint)uVar11;
                  uVar18 = foldkeys[uVar14 - 1] & 0xffffff;
                  if (uVar18 < uVar15) goto LAB_0010c4ad;
                  if (uVar18 == uVar15) {
                    emit_fold_cold_3();
                    goto LAB_0010c5db;
                  }
                  *puVar16 = foldkeys[uVar14 - 1];
                  puVar16 = puVar16 + -1;
                  uVar11 = uVar11 - 1;
                } while ((ulong)(uVar14 - 1) != 0);
                uVar14 = 0;
              }
LAB_0010c4ad:
              foldkeys[uVar14] = uVar19 | uVar20 << 0x18;
              nkeys = uVar3 + 1;
            }
          }
          pcVar9 = fgets((char *)__s_00,0x100,__stream);
          pcVar10 = (char *)foldkeys;
        } while (pcVar9 != (char *)0x0);
      }
      fclose(__stream);
      fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
      uVar20 = nkeys;
      if (nkeys < 0x2000) {
        pcVar10 = "#define fold_hashkey(k)\t(lj_rol(lj_rol((k),%u)-(k),%u)%%%u)\n\n";
        uVar19 = nkeys | 1;
        do {
          __s_00 = (int *)0x0;
          do {
            iVar8 = tryhash((uint32_t *)apcStack_8060,uVar19,(uint32_t)__s_00,0);
            pBVar17 = (BuildCtx *)"#define fold_hashkey(k)\t(((((k)<<%u)-(k))<<%u)%%%u)\n\n";
            uVar20 = uVar19;
            if (iVar8 != 0) goto LAB_0010c582;
            uVar14 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar14;
          } while (uVar14 != 0x400);
          __s_00 = (int *)0x0;
          do {
            iVar8 = tryhash((uint32_t *)apcStack_8060,uVar19,(uint32_t)__s_00,1);
            pBVar17 = (BuildCtx *)pcVar10;
            if (iVar8 != 0) goto LAB_0010c582;
            uVar14 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar14;
          } while (uVar14 != 0x400);
          uVar20 = uVar19 + 2;
          bVar23 = uVar19 < 0x1ffe;
          uVar19 = uVar20;
        } while (bVar23);
      }
      emit_fold_cold_5();
      pBVar17 = (BuildCtx *)pcVar10;
LAB_0010c582:
      printhash(ctx,(uint32_t *)apcStack_8060,uVar20);
      fprintf((FILE *)ctx->fp,(char *)pBVar17,(ulong)__s_00 >> 5 & 0x7ffffff,
              (ulong)((uint)__s_00 & 0x1f),(ulong)uVar20);
      return;
    }
    iVar8 = 0x111aa1;
    __stream = fopen((char *)pBVar17,"r");
    if (__stream != (FILE *)0x0) goto LAB_0010c290;
  }
  emit_fold_cold_1();
  __s = pBVar17->D;
  if (__s != (dasm_State *)0x0) {
    pcVar10 = strchr((char *)__s,0x20);
    if (pcVar10 == (char *)0x0) {
      pdVar13 = (dasm_State *)0x0;
    }
    else {
      pdVar13 = (dasm_State *)(pcVar10 + 1);
      *pcVar10 = '\0';
    }
    pBVar17->D = pdVar13;
    if (iVar8 != 0) {
      iVar8 = strncmp((char *)__s,"IRFPM_",6);
      if (iVar8 == 0) {
        pcVar10 = "FLOOR";
        uVar11 = 0;
        do {
          iVar8 = strcmp(pcVar10,(char *)((long)&__s->psize + 6));
          if (iVar8 == 0) {
            return;
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          pcVar10 = irfpm_names[uVar11];
        } while (pcVar10 != (char *)0x0);
        goto LAB_0010c7f5;
      }
      iVar8 = strncmp((char *)__s,"IRFL_",5);
      if (iVar8 == 0) {
        pcVar10 = "STR_LEN";
        uVar11 = 0;
        do {
          iVar8 = strcmp(pcVar10,(char *)((long)&__s->psize + 5));
          if (iVar8 == 0) {
            return;
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          pcVar10 = irfield_names[uVar11];
        } while (pcVar10 != (char *)0x0);
        goto LAB_0010c7f5;
      }
      iVar8 = strncmp((char *)__s,"IRCALL_",7);
      if (iVar8 == 0) {
        pcVar10 = "lj_str_cmp";
        uVar11 = 0;
        do {
          iVar8 = strcmp(pcVar10,(char *)((long)&__s->psize + 7));
          if (iVar8 == 0) {
            return;
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          pcVar10 = ircall_names[uVar11];
        } while (pcVar10 != (char *)0x0);
        goto LAB_0010c7f5;
      }
      iVar8 = strncmp((char *)__s,"IRCONV_",7);
      if (iVar8 == 0) goto LAB_0010c7fd;
      if ((byte)((char)__s->psize - 0x30U) < 10) {
        do {
          cVar1 = *(char *)((long)&__s->psize + 1);
          __s = (dasm_State *)((long)&__s->psize + 1);
        } while ((byte)(cVar1 - 0x30U) < 10);
        if (cVar1 == '\0') {
          return;
        }
        goto LAB_0010c7f5;
      }
    }
    if ((extraout_EDX == 0) || (iVar8 = strcmp("any",(char *)__s), iVar8 != 0)) {
      pcVar10 = "LT";
      uVar11 = 0;
      do {
        iVar8 = strcmp(pcVar10,(char *)__s);
        if (iVar8 == 0) {
          return;
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        pcVar10 = ir_names[uVar11];
      } while (pcVar10 != (char *)0x0);
LAB_0010c7f5:
      do {
        nexttoken_cold_1();
LAB_0010c7fd:
        pcVar9 = "NIL";
        pcVar10 = (char *)((long)&__s->psize + 7);
        pcVar12 = strchr(pcVar10,0x5f);
        pcStack_81c0 = "NIL";
        uVar11 = 0;
        do {
          if ((pcVar12 != (char *)0x0) &&
             (iVar8 = strncmp(pcVar9,pcVar10,(long)pcVar12 - (long)pcVar10), iVar8 == 0)) {
            uVar22 = 1;
            pcVar9 = pcStack_81c0;
            do {
              iVar8 = strcmp(pcVar9,pcVar12 + 1);
              if (iVar8 == 0) {
                return;
              }
              pcVar9 = irt_names[uVar22];
              uVar22 = (ulong)((int)uVar22 + 1);
            } while (pcVar9 != (char *)0x0);
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          pcVar9 = irt_names[uVar11];
        } while (pcVar9 != (char *)0x0);
      } while( true );
    }
  }
  return;
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}